

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  short sVar1;
  long lVar2;
  long lVar3;
  Chunk CVar4;
  uint uVar5;
  
  sVar1 = this->used_bigits_;
  lVar2 = (long)sVar1;
  if (lVar2 < 1) {
    CVar4 = 0;
  }
  else {
    lVar3 = 0;
    uVar5 = 0;
    do {
      CVar4 = this->bigits_buffer_[lVar3] >> (0x1c - (byte)shift_amount & 0x1f);
      this->bigits_buffer_[lVar3] =
           (this->bigits_buffer_[lVar3] << ((byte)shift_amount & 0x1f)) + uVar5 & 0xfffffff;
      lVar3 = lVar3 + 1;
      uVar5 = CVar4;
    } while (lVar2 != lVar3);
  }
  if (CVar4 != 0) {
    this->bigits_buffer_[lVar2] = CVar4;
    this->used_bigits_ = sVar1 + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(const int shift_amount) {
  DOUBLE_CONVERSION_ASSERT(shift_amount < kBigitSize);
  DOUBLE_CONVERSION_ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const Chunk new_carry = RawBigit(i) >> (kBigitSize - shift_amount);
    RawBigit(i) = ((RawBigit(i) << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    RawBigit(used_bigits_) = carry;
    used_bigits_++;
  }
}